

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::Inserter::setup
          (Inserter *this,qsizetype pos,qsizetype n)

{
  OrderedScreen *pOVar1;
  long lVar2;
  long lVar3;
  
  pOVar1 = this->begin;
  lVar2 = this->size;
  this->end = pOVar1 + lVar2;
  this->last = pOVar1 + lVar2 + -1;
  lVar2 = lVar2 - pos;
  this->where = pOVar1 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = n;
  lVar3 = n - lVar2;
  this->move = lVar3;
  this->sourceCopyAssign = n;
  if (lVar3 != 0 && lVar2 <= n) {
    this->sourceCopyConstruct = lVar3;
    this->move = 0;
    this->sourceCopyAssign = lVar2;
  }
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }